

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O3

void __thiscall
VectorWriter::VectorWriter<BlockTransactions&>
          (VectorWriter *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vchDataIn,
          size_t nPosIn,BlockTransactions *args)

{
  BlockTransactions *__n;
  long in_FS_OFFSET;
  ParamsStream<VectorWriter_&,_TransactionSerParams> local_38;
  VectorFormatter<DefaultFormatter> local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->vchData = vchDataIn;
  this->nPos = nPosIn;
  __n = args;
  if ((ulong)((long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(vchDataIn->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) < nPosIn) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchDataIn,nPosIn);
  }
  write(this,(int)args,(void *)0x20,(size_t)__n);
  local_38.m_params = &::TX_WITH_WITNESS;
  local_38.m_substream = this;
  VectorFormatter<DefaultFormatter>::
  Ser<ParamsStream<VectorWriter&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
            (&local_21,&local_38,&args->txn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VectorWriter(std::vector<unsigned char>& vchDataIn, size_t nPosIn, Args&&... args) : VectorWriter{vchDataIn, nPosIn}
    {
        ::SerializeMany(*this, std::forward<Args>(args)...);
    }